

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t number;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  FieldDescriptor *f;
  FieldDescriptor *local_c0;
  FieldDescriptor *field_lhs;
  MessageWrapper rhs_wrapper;
  undefined1 auStack_98 [8];
  MessageWrapper lhs_wrapper;
  undefined1 local_78 [8];
  LocalVarWrapper temp;
  uint32_t oneof_case_rhs;
  uint32_t oneof_case_lhs;
  Voidify local_29;
  OneofDescriptor *local_28;
  OneofDescriptor *oneof_descriptor_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  local_28 = oneof_descriptor;
  oneof_descriptor_local = (OneofDescriptor *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)this;
  bVar2 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&oneof_case_lhs,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x42e,"!oneof_descriptor->is_synthetic()");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&oneof_case_lhs);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&oneof_case_lhs);
  }
  number = GetOneofCase(this,rhs_local,local_28);
  temp.val.
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
  ._36_4_ = GetOneofCase(this,(Message *)oneof_descriptor_local,local_28);
  SwapOneofField<true>::LocalVarWrapper::LocalVarWrapper((LocalVarWrapper *)local_78);
  local_c0 = (FieldDescriptor *)0x0;
  if (number != 0) {
    local_c0 = Descriptor::FindFieldByNumber(this->descriptor_,number);
    lhs_wrapper.reflection = (Reflection *)rhs_local;
    auStack_98 = (undefined1  [8])this;
    lhs_wrapper.message = (Message *)local_c0;
    InternalMoveOneofField<true,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::LocalVarWrapper>
              (this,local_c0,(MessageWrapper *)auStack_98,(LocalVarWrapper *)local_78);
  }
  if (temp.val.
      super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
      .
      super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
      .
      super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
      ._36_4_ != 0) {
    rhs_wrapper.message =
         (Message *)
         Descriptor::FindFieldByNumber
                   (this->descriptor_,
                    temp.val.
                    super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
                    .
                    super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
                    .
                    super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
                    .
                    super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
                    ._36_4_);
    lhs_wrapper.reflection = (Reflection *)rhs_local;
    rhs_wrapper.reflection = (Reflection *)oneof_descriptor_local;
    field_lhs = (FieldDescriptor *)this;
    auStack_98 = (undefined1  [8])this;
    lhs_wrapper.message = rhs_wrapper.message;
    InternalMoveOneofField<true,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper>
              (this,(FieldDescriptor *)rhs_wrapper.message,(MessageWrapper *)&field_lhs,
               (MessageWrapper *)auStack_98);
  }
  if (number != 0) {
    rhs_wrapper.message = (Message *)local_c0;
    rhs_wrapper.reflection = (Reflection *)oneof_descriptor_local;
    field_lhs = (FieldDescriptor *)this;
    InternalMoveOneofField<true,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::LocalVarWrapper,google::protobuf::Reflection::SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)const::MessageWrapper>
              (this,local_c0,(LocalVarWrapper *)local_78,(MessageWrapper *)&field_lhs);
  }
  uVar1 = temp.val.
          super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
          .
          super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_float,_double,_bool,_google::protobuf::Message_*,_google::protobuf::internal::ArenaStringPtr,_google::protobuf::internal::MicroString,_absl::lts_20250127::Cord_*,_std::__cxx11::basic_string<char>_>
          ._36_4_;
  puVar4 = MutableOneofCase(this,rhs_local,local_28);
  *puVar4 = uVar1;
  puVar4 = MutableOneofCase(this,(Message *)oneof_descriptor_local,local_28);
  *puVar4 = number;
  SwapOneofField<true>::LocalVarWrapper::~LocalVarWrapper((LocalVarWrapper *)local_78);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, name)                   \
  type Get##name() const { return std::get<type>(val); } \
  void Set##name(type v) { val.emplace<type>(v); }

    LOCAL_VAR_ACCESSOR(int32_t, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, Uint64);
    LOCAL_VAR_ACCESSOR(float, Float);
    LOCAL_VAR_ACCESSOR(double, Double);
    LOCAL_VAR_ACCESSOR(bool, Bool);
    LOCAL_VAR_ACCESSOR(int, Enum);
    LOCAL_VAR_ACCESSOR(Message*, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, ArenaStringPtr);
    LOCAL_VAR_ACCESSOR(MicroString, MicroString);
    LOCAL_VAR_ACCESSOR(absl::Cord*, Cord);
    LOCAL_VAR_ACCESSOR(std::string, String);
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}
    SwapOneofFieldVariant val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, name)              \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, Float);
    MESSAGE_FIELD_ACCESSOR(double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, ArenaStringPtr);
    MESSAGE_FIELD_ACCESSOR(MicroString, MicroString);
    MESSAGE_FIELD_ACCESSOR(absl::Cord*, Cord);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  uint32_t oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32_t oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    InternalMoveOneofField<unsafe_shallow_swap>(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    InternalMoveOneofField<unsafe_shallow_swap>(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    InternalMoveOneofField<unsafe_shallow_swap>(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}